

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffsetstringarray_p.h
# Opt level: O3

View __thiscall
QOffsetStringArray<std::array<char,_13UL>,_std::array<unsigned_char,_3UL>_>::viewAt
          (QOffsetStringArray<std::array<char,_13UL>,_std::array<unsigned_char,_3UL>_> *this,
          qsizetype index)

{
  ulong uVar1;
  View VVar2;
  
  if ((ulong)index < 3) {
    if (index != 2) {
      uVar1 = (ulong)(this->m_offsets)._M_elems[index];
      VVar2.m_size = ~uVar1 + (ulong)(this->m_offsets)._M_elems[index + 1];
      VVar2.m_data = (this->m_string)._M_elems + uVar1;
      return VVar2;
    }
  }
  else {
    QOffsetStringArray<std::array<char,13ul>,std::array<unsigned_char,3ul>>::viewAt();
  }
  QOffsetStringArray<std::array<char,13ul>,std::array<unsigned_char,3ul>>::viewAt();
}

Assistant:

constexpr View viewAt(qsizetype index) const noexcept
    {
        return { m_string.data() + m_offsets[index],
                    qsizetype(m_offsets[index + 1]) - qsizetype(m_offsets[index]) - 1 };
    }